

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTargetCollectLinkLanguages::Visit(cmTargetCollectLinkLanguages *this,cmLinkItem *item)

{
  hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *this_00;
  bool bVar1;
  PolicyStatus PVar2;
  long lVar3;
  ostream *poVar4;
  string *psVar5;
  cmake *this_01;
  cmListFileBacktrace *bt;
  reference __obj;
  reference item_00;
  PolicyID id;
  pair<std::_Rb_tree_const_iterator<const_cmTarget_*>,_bool> pVar6;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_248;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_240;
  const_iterator li_1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_220;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  const_iterator li;
  LinkInterface *iface;
  string local_1e8;
  string local_1c8;
  undefined1 local_198 [8];
  ostringstream e;
  MessageType local_20;
  MessageType messageType;
  bool noMessage;
  cmLinkItem *item_local;
  cmTargetCollectLinkLanguages *this_local;
  
  if (item->Target == (cmTarget *)0x0) {
    lVar3 = std::__cxx11::string::find((char *)item,0x8d3d54);
    if (lVar3 != -1) {
      bVar1 = false;
      local_20 = FATAL_ERROR;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      PVar2 = cmMakefile::GetPolicyStatus(this->Makefile,CMP0028);
      if (PVar2 == OLD) {
        bVar1 = true;
      }
      else if (PVar2 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x1c,id);
        poVar4 = std::operator<<((ostream *)local_198,(string *)&local_1c8);
        std::operator<<(poVar4,"\n");
        std::__cxx11::string::~string((string *)&local_1c8);
        local_20 = AUTHOR_WARNING;
      }
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)local_198,"Target \"");
        psVar5 = cmTarget::GetName_abi_cxx11_(this->Target);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,"\" links to target \"");
        poVar4 = std::operator<<(poVar4,(string *)item);
        std::operator<<(poVar4,
                        "\" but the target was not found.  Perhaps a find_package() call is missing for an IMPORTED target, or an ALIAS target is missing?"
                       );
        this_01 = cmMakefile::GetCMakeInstance(this->Makefile);
        std::__cxx11::ostringstream::str();
        bt = cmTarget::GetBacktrace(this->Target);
        cmake::IssueMessage(this_01,local_20,&local_1e8,bt);
        std::__cxx11::string::~string((string *)&local_1e8);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    }
  }
  else {
    pVar6 = std::
            set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::
            insert(&this->Visited,&item->Target);
    if ((((pVar6.second ^ 0xffU) & 1) == 0) &&
       (li._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmTarget::GetLinkInterface(item->Target,&this->Config,this->HeadTarget),
       (LinkInterface *)li._M_current != (LinkInterface *)0x0)) {
      local_218._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&((LinkInterface *)li._M_current)->Languages);
      while( true ) {
        local_220._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&(li._M_current)->field_2 + 8));
        bVar1 = __gnu_cxx::operator!=(&local_218,&local_220);
        if (!bVar1) break;
        this_00 = this->Languages;
        __obj = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_218);
        cmsys::
        hash_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
        ::insert((pair<cmsys::_Hashtable_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmsys::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_cmsys::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>,_bool>
                  *)&li_1,this_00,__obj);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_218);
      }
      local_240._M_current =
           (cmLinkItem *)
           std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                     ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)li._M_current);
      while( true ) {
        local_248._M_current =
             (cmLinkItem *)
             std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                       ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)li._M_current);
        bVar1 = __gnu_cxx::operator!=(&local_240,&local_248);
        if (!bVar1) break;
        item_00 = __gnu_cxx::
                  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                  ::operator*(&local_240);
        Visit(this,item_00);
        __gnu_cxx::
        __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
        ::operator++(&local_240);
      }
    }
  }
  return;
}

Assistant:

void Visit(cmLinkItem const& item)
    {
    if(!item.Target)
      {
      if(item.find("::") != std::string::npos)
        {
        bool noMessage = false;
        cmake::MessageType messageType = cmake::FATAL_ERROR;
        std::ostringstream e;
        switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0028))
          {
          case cmPolicies::WARN:
            {
            e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0028) << "\n";
            messageType = cmake::AUTHOR_WARNING;
            }
            break;
          case cmPolicies::OLD:
            noMessage = true;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            // Issue the fatal message.
            break;
          }

        if(!noMessage)
          {
          e << "Target \"" << this->Target->GetName()
            << "\" links to target \"" << item
            << "\" but the target was not found.  Perhaps a find_package() "
            "call is missing for an IMPORTED target, or an ALIAS target is "
            "missing?";
          this->Makefile->GetCMakeInstance()->IssueMessage(messageType,
                                                e.str(),
                                                this->Target->GetBacktrace());
          }
        }
      return;
      }
    if(!this->Visited.insert(item.Target).second)
      {
      return;
      }

    cmTarget::LinkInterface const* iface =
      item.Target->GetLinkInterface(this->Config, this->HeadTarget);
    if(!iface) { return; }

    for(std::vector<std::string>::const_iterator
          li = iface->Languages.begin(); li != iface->Languages.end(); ++li)
      {
      this->Languages.insert(*li);
      }

    for(std::vector<cmLinkItem>::const_iterator
          li = iface->Libraries.begin(); li != iface->Libraries.end(); ++li)
      {
      this->Visit(*li);
      }
    }